

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O1

void ymf278b_alloc_ram(void *info,UINT32 memsize)

{
  void *__s;
  YMF278BChip *chip;
  
  if (*(UINT32 *)((long)info + 0x530) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)info + 0x538),(ulong)memsize);
  *(void **)((long)info + 0x538) = __s;
  *(UINT32 *)((long)info + 0x530) = memsize;
  memset(__s,0,(ulong)memsize);
  return;
}

Assistant:

static void ymf278b_alloc_ram(void* info, UINT32 memsize)
{
	YMF278BChip *chip = (YMF278BChip *)info;
	
	if (chip->RAMSize == memsize)
		return;
	
	chip->ram = (UINT8*)realloc(chip->ram, memsize);
	chip->RAMSize = memsize;
	memset(chip->ram, 0, chip->RAMSize);
	
	return;
}